

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall ON_SubDHeap::IsValid(ON_SubDHeap *this,bool bSilentError,ON_TextLog *text_log)

{
  bool bVar1;
  uint uVar2;
  uint max_fspf_max_id;
  uint max_fspe_max_id;
  uint max_fspv_max_id;
  ON_TextLog *text_log_local;
  bool bSilentError_local;
  ON_SubDHeap *this_local;
  
  bVar1 = ON_FixedSizePool::ElementIdIsIncreasing(&this->m_fspv,m_offset_vertex_id);
  if (bVar1) {
    bVar1 = ON_FixedSizePool::ElementIdIsIncreasing(&this->m_fspe,m_offset_edge_id);
    if (bVar1) {
      bVar1 = ON_FixedSizePool::ElementIdIsIncreasing(&this->m_fspf,m_offset_face_id);
      if (bVar1) {
        uVar2 = ON_FixedSizePool::MaximumElementId(&this->m_fspv,m_offset_vertex_id);
        if (this->m_max_vertex_id == uVar2) {
          uVar2 = ON_FixedSizePool::MaximumElementId(&this->m_fspe,m_offset_edge_id);
          if (this->m_max_edge_id == uVar2) {
            uVar2 = ON_FixedSizePool::MaximumElementId(&this->m_fspf,m_offset_face_id);
            if (this->m_max_face_id == uVar2) {
              this_local._7_1_ = true;
            }
            else {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"m_max_face_id = %u != %u = m_fspf.MaximumElementId()\n",
                                  (ulong)this->m_max_face_id,(ulong)uVar2);
              }
              this_local._7_1_ = ON_SubDHeapIsNotValid(bSilentError);
            }
          }
          else {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"m_max_edge_id = %u != %u = m_fspe.MaximumElementId()\n",
                                (ulong)this->m_max_edge_id,(ulong)uVar2);
            }
            this_local._7_1_ = ON_SubDHeapIsNotValid(bSilentError);
          }
        }
        else {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"m_max_vertex_id = %u != %u = m_fspv.MaximumElementId()\n",
                              (ulong)this->m_max_vertex_id,(ulong)uVar2);
          }
          this_local._7_1_ = ON_SubDHeapIsNotValid(bSilentError);
        }
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"m_fspf.ElementIdIsIncreasing() is false.");
        }
        this_local._7_1_ = ON_SubDHeapIsNotValid(bSilentError);
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"m_fspe.ElementIdIsIncreasing() is false.");
      }
      this_local._7_1_ = ON_SubDHeapIsNotValid(bSilentError);
    }
  }
  else {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"m_fspv.ElementIdIsIncreasing() is false.");
    }
    this_local._7_1_ = ON_SubDHeapIsNotValid(bSilentError);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDHeap::IsValid(
  bool bSilentError,
  ON_TextLog* text_log
) const
{
  if (false == m_fspv.ElementIdIsIncreasing(ON_SubDHeap::m_offset_vertex_id))
  {
    if (nullptr != text_log)
      text_log->Print("m_fspv.ElementIdIsIncreasing() is false.");
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  if (false == m_fspe.ElementIdIsIncreasing(ON_SubDHeap::m_offset_edge_id))
  {
    if (nullptr != text_log)
      text_log->Print("m_fspe.ElementIdIsIncreasing() is false.");
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  if (false == m_fspf.ElementIdIsIncreasing(ON_SubDHeap::m_offset_face_id))
  {
    if (nullptr != text_log)
      text_log->Print("m_fspf.ElementIdIsIncreasing() is false.");
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  const unsigned max_fspv_max_id = m_fspv.MaximumElementId(ON_SubDHeap::m_offset_vertex_id);
  if (m_max_vertex_id != max_fspv_max_id)
  {
    if (nullptr != text_log)
      text_log->Print("m_max_vertex_id = %u != %u = m_fspv.MaximumElementId()\n", m_max_vertex_id, max_fspv_max_id);
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  const unsigned max_fspe_max_id = m_fspe.MaximumElementId(ON_SubDHeap::m_offset_edge_id);
  if (m_max_edge_id != max_fspe_max_id)
  {
    if (nullptr != text_log)
      text_log->Print("m_max_edge_id = %u != %u = m_fspe.MaximumElementId()\n", m_max_edge_id, max_fspe_max_id);
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  const unsigned max_fspf_max_id = m_fspf.MaximumElementId(ON_SubDHeap::m_offset_face_id);
  if (m_max_face_id != max_fspf_max_id)
  {
    if (nullptr != text_log)
      text_log->Print("m_max_face_id = %u != %u = m_fspf.MaximumElementId()\n", m_max_face_id, max_fspf_max_id);
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  return true;
}